

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
PDA::getCFGVariables_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,PDA *this)

{
  State *this_00;
  State *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  reference ppSVar2;
  reference pbVar3;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string variableName;
  string inputX;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  State *stateQ;
  iterator __end2;
  iterator __begin2;
  vector<State_*,_std::allocator<State_*>_> *__range2;
  State *stateP;
  iterator __end1;
  iterator __begin1;
  vector<State_*,_std::allocator<State_*>_> *__range1;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  iterator local_30;
  size_type local_28;
  undefined1 local_19;
  undefined8 local_18;
  PDA *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variables;
  
  local_19 = '\0';
  __range1._3_1_ = 1;
  local_58 = &local_50;
  local_18 = this;
  this_local = (PDA *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"S",&local_59);
  __range1._3_1_ = 0;
  local_30 = &local_50;
  local_28 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&__range1 + 2));
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&__range1 + 2));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&__range1 + 2));
  local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30;
  do {
    local_1d8 = local_1d8 + -1;
    std::__cxx11::string::~string((string *)local_1d8);
  } while (local_1d8 != &local_50);
  std::allocator<char>::~allocator(&local_59);
  __end1 = std::vector<State_*,_std::allocator<State_*>_>::begin(&this->statesQ);
  stateP = (State *)std::vector<State_*,_std::allocator<State_*>_>::end(&this->statesQ);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>
                                     *)&stateP), bVar1) {
    ppSVar2 = __gnu_cxx::
              __normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>::
              operator*(&__end1);
    this_00 = *ppSVar2;
    __end2 = std::vector<State_*,_std::allocator<State_*>_>::begin(&this->statesQ);
    stateQ = (State *)std::vector<State_*,_std::allocator<State_*>_>::end(&this->statesQ);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>
                                       *)&stateQ), bVar1) {
      ppSVar2 = __gnu_cxx::
                __normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>::
                operator*(&__end2);
      this_01 = *ppSVar2;
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->stackAlphabetG);
      inputX.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->stackAlphabetG);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)((long)&inputX.field_2 + 8)), bVar1) {
        pbVar3 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
        std::__cxx11::string::string
                  ((string *)(variableName.field_2._M_local_buf + 8),(string *)pbVar3);
        psVar4 = State::getName_abi_cxx11_(this_00);
        std::operator+(&local_168,"[",psVar4);
        std::operator+(&local_148,&local_168,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&variableName.field_2 + 8));
        psVar4 = State::getName_abi_cxx11_(this_01);
        std::operator+(&local_128,&local_148,psVar4);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,&local_128,"]");
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::string((string *)&local_188,(string *)local_108);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1a0,__return_storage_ptr__);
        bVar1 = inVector(&local_188,&local_1a0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1a0);
        std::__cxx11::string::~string((string *)&local_188);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108)
          ;
        }
        std::__cxx11::string::~string((string *)local_108);
        std::__cxx11::string::~string((string *)(variableName.field_2._M_local_buf + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      __gnu_cxx::__normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>::
      operator++(&__end2);
    }
    __gnu_cxx::__normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> PDA::getCFGVariables() {

    std::vector<std::string> variables = {"S"};

    for (State* stateP: statesQ){
        for (State* stateQ: statesQ){
            for(std::string inputX: stackAlphabetG){ // TODO: Check whether stackAlphabetG contains all elements  of the alphabet
                std::string variableName = "[" + stateP->getName() + inputX + stateQ->getName() + "]";
                if(!inVector(variableName, variables)){
                    variables.emplace_back(variableName);
                }
            }
        }
    }

    return variables;
}